

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

FeatureSet __thiscall wasm::Type::getFeatures(Type *this)

{
  FeatureSet FVar1;
  Type *pTVar2;
  Type *pTVar3;
  FeatureSet FVar4;
  Type *pTVar5;
  HeapType local_50;
  Type local_48;
  undefined1 local_40 [8];
  Iterator __begin2;
  
  local_40 = (undefined1  [8])this->id;
  if (((ulong)local_40 & 1) == 0 || (ulong)local_40 < (Type *)0x7) {
    if (((ulong)local_40 & 1) == 0 && (Type *)0x6 < (ulong)local_40) {
      local_48.id = (uintptr_t)getHeapType((Type *)local_40);
      FVar4 = HeapType::getFeatures((HeapType *)&local_48);
    }
    else {
      if ((Type *)0x6 < (ulong)local_40) {
LAB_00cac9e6:
        __assert_fail("isBasic() && \"Basic type expected\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                      ,0x1c4,"BasicType wasm::Type::getBasic() const");
      }
      FVar4.features = (uint)(local_40 == (undefined1  [8])0x6) << 3;
    }
  }
  else {
    __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    local_40 = (undefined1  [8])this;
    pTVar2 = (Type *)size(this);
    if (pTVar2 == (Type *)0x0) {
      FVar4.features = 0x200;
    }
    else {
      FVar4.features = 0x200;
      pTVar3 = (Type *)0x1;
      do {
        pTVar5 = pTVar3;
        pTVar3 = Iterator::operator*((Iterator *)local_40);
        local_48.id = pTVar3->id;
        if ((local_48.id & 1) == 0 && 6 < local_48.id) {
          local_50 = getHeapType(&local_48);
          FVar1 = HeapType::getFeatures(&local_50);
        }
        else {
          if (6 < local_48.id) goto LAB_00cac9e6;
          FVar1.features = (uint)(local_48.id == 6) << 3;
        }
        FVar4.features = FVar4.features | FVar1.features;
        pTVar3 = (Type *)((long)&pTVar5->id + 1);
        __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = pTVar5
        ;
      } while (pTVar5 != pTVar2);
    }
  }
  return (FeatureSet)FVar4.features;
}

Assistant:

FeatureSet Type::getFeatures() const {
  auto getSingleFeatures = [](Type t) -> FeatureSet {
    if (t.isRef()) {
      return t.getHeapType().getFeatures();
    }

    switch (t.getBasic()) {
      case Type::v128:
        return FeatureSet::SIMD;
      default:
        return FeatureSet::MVP;
    }
  };

  if (isTuple()) {
    FeatureSet feats = FeatureSet::Multivalue;
    for (const auto& t : *this) {
      feats |= getSingleFeatures(t);
    }
    return feats;
  }
  return getSingleFeatures(*this);
}